

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O3

void __thiscall HEkkPrimal::chooseColumn(HEkkPrimal *this,bool hyper_sparse)

{
  double dVar1;
  int ix;
  HEkk *pHVar2;
  pointer pdVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer pcVar6;
  byte bVar7;
  int iVar8;
  undefined7 in_register_00000031;
  long lVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  
  pHVar2 = this->ekk_instance_;
  this->variable_in = -1;
  if ((int)CONCAT71(in_register_00000031,hyper_sparse) == 0) {
    HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x29,0);
    lVar10 = (long)(this->nonbasic_free_col_set).count_;
    if (lVar10 < 1) {
      dVar11 = 0.0;
    }
    else {
      piVar4 = (this->nonbasic_free_col_set).entry_.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pdVar3 = (pHVar2->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>._M_impl
               .super__Vector_impl_data._M_start;
      pdVar5 = (this->edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar11 = 0.0;
      lVar9 = 0;
      do {
        iVar8 = piVar4[lVar9];
        dVar12 = pdVar3[iVar8];
        if (this->dual_feasibility_tolerance < ABS(dVar12)) {
          dVar1 = pdVar5[iVar8];
          if (dVar11 * dVar1 < dVar12 * dVar12) {
            this->variable_in = iVar8;
            dVar11 = (dVar12 * dVar12) / dVar1;
          }
        }
        lVar9 = lVar9 + 1;
      } while (lVar10 != lVar9);
    }
    if (0 < (long)this->num_tot) {
      pcVar6 = (pHVar2->basis_).nonbasicMove_.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (pHVar2->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>._M_impl
               .super__Vector_impl_data._M_start;
      pdVar5 = (this->edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar10 = 0;
      do {
        dVar12 = (double)-(int)pcVar6[lVar10] * pdVar3[lVar10];
        if (this->dual_feasibility_tolerance < dVar12) {
          dVar1 = pdVar5[lVar10];
          if (dVar11 * dVar1 < dVar12 * dVar12) {
            this->variable_in = (HighsInt)lVar10;
            dVar11 = (dVar12 * dVar12) / dVar1;
          }
        }
        lVar10 = lVar10 + 1;
      } while (this->num_tot != lVar10);
    }
    HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x29,0);
    return;
  }
  bVar7 = this->initialise_hyper_chuzc;
  if ((bool)bVar7 == false) {
    hyperChooseColumn(this);
    bVar7 = this->initialise_hyper_chuzc;
  }
  if ((bVar7 & 1) != 0) {
    HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x2a,0);
    this->num_hyper_chuzc_candidates = 0;
    iVar8 = (this->nonbasic_free_col_set).count_;
    if ((iVar8 != 0) && (0 < iVar8)) {
      lVar10 = 0;
      do {
        ix = (this->nonbasic_free_col_set).entry_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar10];
        dVar11 = (pHVar2->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[ix];
        if (this->dual_feasibility_tolerance <= ABS(dVar11) &&
            ABS(dVar11) != this->dual_feasibility_tolerance) {
          addToDecreasingHeap(&this->num_hyper_chuzc_candidates,this->max_num_hyper_chuzc_candidates
                              ,&this->hyper_chuzc_measure,&this->hyper_chuzc_candidate,
                              (dVar11 * dVar11) /
                              (this->edge_weight_).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[ix],ix);
          iVar8 = (this->nonbasic_free_col_set).count_;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < iVar8);
    }
    iVar8 = this->num_tot;
    if (0 < iVar8) {
      lVar10 = 0;
      do {
        dVar11 = (double)-(int)(pHVar2->basis_).nonbasicMove_.
                               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
                               .super__Vector_impl_data._M_start[lVar10] *
                 (pHVar2->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar10];
        if (this->dual_feasibility_tolerance <= dVar11 && dVar11 != this->dual_feasibility_tolerance
           ) {
          addToDecreasingHeap(&this->num_hyper_chuzc_candidates,this->max_num_hyper_chuzc_candidates
                              ,&this->hyper_chuzc_measure,&this->hyper_chuzc_candidate,
                              (dVar11 * dVar11) /
                              (this->edge_weight_).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar10],(HighsInt)lVar10);
          iVar8 = this->num_tot;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < iVar8);
    }
    sortDecreasingHeap(this->num_hyper_chuzc_candidates,&this->hyper_chuzc_measure,
                       &this->hyper_chuzc_candidate);
    this->initialise_hyper_chuzc = false;
    HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x2a,0);
    if ((long)this->num_hyper_chuzc_candidates != 0) {
      pdVar3 = (this->hyper_chuzc_measure).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      this->variable_in =
           (this->hyper_chuzc_candidate).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[1];
      dVar11 = pdVar3[1];
      this->max_hyper_chuzc_non_candidate_measure = pdVar3[this->num_hyper_chuzc_candidates];
      if (this->report_hyper_chuzc == true) {
        printf("Full CHUZC: Max         measure is %9.4g for column %4d, and max non-candidate measure of  %9.4g\n"
               ,dVar11);
        return;
      }
    }
  }
  return;
}

Assistant:

void HEkkPrimal::chooseColumn(const bool hyper_sparse) {
  assert(!hyper_sparse || !done_next_chuzc);
  const vector<int8_t>& nonbasicMove = ekk_instance_.basis_.nonbasicMove_;
  const vector<double>& workDual = ekk_instance_.info_.workDual_;
  double best_measure = 0;
  variable_in = -1;

  const bool local_use_hyper_chuzc = hyper_sparse;
  // Consider nonbasic free columns first
  const HighsInt& num_nonbasic_free_col = nonbasic_free_col_set.count();
  if (local_use_hyper_chuzc) {
    if (!initialise_hyper_chuzc) hyperChooseColumn();
    if (initialise_hyper_chuzc) {
      analysis->simplexTimerStart(ChuzcHyperInitialiselClock);
      num_hyper_chuzc_candidates = 0;
      if (num_nonbasic_free_col) {
        const vector<HighsInt>& nonbasic_free_col_set_entry =
            nonbasic_free_col_set.entry();
        for (HighsInt ix = 0; ix < num_nonbasic_free_col; ix++) {
          HighsInt iCol = nonbasic_free_col_set_entry[ix];
          double dual_infeasibility = fabs(workDual[iCol]);
          if (dual_infeasibility > dual_feasibility_tolerance) {
            double measure =
                dual_infeasibility * dual_infeasibility / edge_weight_[iCol];
            addToDecreasingHeap(
                num_hyper_chuzc_candidates, max_num_hyper_chuzc_candidates,
                hyper_chuzc_measure, hyper_chuzc_candidate, measure, iCol);
          }
        }
      }
      // Now look at other columns
      for (HighsInt iCol = 0; iCol < num_tot; iCol++) {
        double dual_infeasibility = -nonbasicMove[iCol] * workDual[iCol];
        if (dual_infeasibility > dual_feasibility_tolerance) {
          double measure =
              dual_infeasibility * dual_infeasibility / edge_weight_[iCol];
          addToDecreasingHeap(
              num_hyper_chuzc_candidates, max_num_hyper_chuzc_candidates,
              hyper_chuzc_measure, hyper_chuzc_candidate, measure, iCol);
        }
      }
      // Sort the heap
      sortDecreasingHeap(num_hyper_chuzc_candidates, hyper_chuzc_measure,
                         hyper_chuzc_candidate);
      initialise_hyper_chuzc = false;
      analysis->simplexTimerStop(ChuzcHyperInitialiselClock);
      // Choose the first entry - if there is one
      if (num_hyper_chuzc_candidates) {
        variable_in = hyper_chuzc_candidate[1];
        best_measure = hyper_chuzc_measure[1];
        max_hyper_chuzc_non_candidate_measure =
            hyper_chuzc_measure[num_hyper_chuzc_candidates];
        if (report_hyper_chuzc)
          printf(
              "Full CHUZC: Max         measure is %9.4g for column "
              "%4" HIGHSINT_FORMAT
              ", and "
              "max non-candidate measure of  %9.4g\n",
              best_measure, variable_in, max_hyper_chuzc_non_candidate_measure);
      }
    }
  } else {
    analysis->simplexTimerStart(ChuzcPrimalClock);
    // Choose any attractive nonbasic free column
    if (num_nonbasic_free_col) {
      const vector<HighsInt>& nonbasic_free_col_set_entry =
          nonbasic_free_col_set.entry();
      for (HighsInt ix = 0; ix < num_nonbasic_free_col; ix++) {
        HighsInt iCol = nonbasic_free_col_set_entry[ix];
        double dual_infeasibility = fabs(workDual[iCol]);
        if (dual_infeasibility > dual_feasibility_tolerance &&
            dual_infeasibility * dual_infeasibility >
                best_measure * edge_weight_[iCol]) {
          variable_in = iCol;
          best_measure =
              dual_infeasibility * dual_infeasibility / edge_weight_[iCol];
        }
      }
    }
    // Now look at other columns
    for (HighsInt iCol = 0; iCol < num_tot; iCol++) {
      double dual_infeasibility = -nonbasicMove[iCol] * workDual[iCol];
      if (dual_infeasibility > dual_feasibility_tolerance &&
          dual_infeasibility * dual_infeasibility >
              best_measure * edge_weight_[iCol]) {
        variable_in = iCol;
        best_measure =
            dual_infeasibility * dual_infeasibility / edge_weight_[iCol];
      }
    }
    analysis->simplexTimerStop(ChuzcPrimalClock);
  }
  //  printf("ChooseColumn: Iteration %" HIGHSINT_FORMAT ", choose column %"
  //  HIGHSINT_FORMAT " with measure %g\n",
  //	 ekk_instance_.iteration_count_, variable_in, best_measure);
}